

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# issue178_test.cc
# Opt level: O2

void anon_unknown.dwarf_a012::_Test_Test::_RunIt(void)

{
  char cVar1;
  int iVar2;
  undefined4 extraout_var;
  Tester *this;
  int i_00;
  int i_01;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 uVar4;
  undefined8 extraout_RDX_04;
  size_t i;
  ulong uVar5;
  size_t sVar6;
  DB *db;
  string start_key;
  WriteBatch batch;
  string end_key;
  size_t num_keys;
  Status local_280;
  Status local_278;
  string dbpath;
  pointer local_250;
  char *pcStack_248;
  Slice greatest;
  Slice least;
  Options db_options;
  long *plVar3;
  
  leveldb::test::TmpDir_abi_cxx11_();
  std::operator+(&dbpath,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_250,"/leveldb_cbug_test");
  std::__cxx11::string::~string((string *)&local_250);
  leveldb::Options::Options((Options *)&local_250);
  leveldb::DestroyDB((leveldb *)&local_278,&dbpath,(Options *)&local_250);
  leveldb::Status::~Status(&local_278);
  leveldb::Options::Options(&db_options);
  db_options.create_if_missing = true;
  db_options.compression = kNoCompression;
  leveldb::test::Tester::Tester
            ((Tester *)&local_250,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/issues/issue178_test.cc"
             ,0x28);
  leveldb::DB::Open((DB *)&batch,&db_options,&dbpath,&db);
  leveldb::test::Tester::IsOk((Tester *)&local_250,(Status *)&batch);
  leveldb::Status::~Status((Status *)&batch);
  leveldb::test::Tester::~Tester((Tester *)&local_250);
  leveldb::WriteBatch::WriteBatch(&batch);
  uVar4 = extraout_RDX;
  for (uVar5 = 0; uVar5 != 1100000; uVar5 = uVar5 + 1) {
    (anonymous_namespace)::Key1_abi_cxx11_
              ((string *)&local_250,(_anonymous_namespace_ *)(uVar5 & 0xffffffff),(int)uVar4);
    start_key._M_dataplus._M_p = local_250;
    start_key._M_string_length = (size_type)pcStack_248;
    end_key._M_dataplus._M_p = "value for range 1 key";
    end_key._M_string_length = 0x15;
    leveldb::WriteBatch::Put(&batch,(Slice *)&start_key,(Slice *)&end_key);
    std::__cxx11::string::~string((string *)&local_250);
    uVar4 = extraout_RDX_00;
  }
  leveldb::test::Tester::Tester
            ((Tester *)&local_250,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/issues/issue178_test.cc"
             ,0x2f);
  end_key._M_dataplus._M_p = end_key._M_dataplus._M_p & 0xffffffffffffff00;
  (*db->_vptr_DB[4])(&start_key,db,&end_key,&batch);
  leveldb::test::Tester::IsOk((Tester *)&local_250,(Status *)&start_key);
  leveldb::Status::~Status((Status *)&start_key);
  leveldb::test::Tester::~Tester((Tester *)&local_250);
  leveldb::WriteBatch::Clear(&batch);
  uVar4 = extraout_RDX_01;
  for (uVar5 = 0; uVar5 != 1100000; uVar5 = uVar5 + 1) {
    (anonymous_namespace)::Key2_abi_cxx11_
              ((string *)&local_250,(_anonymous_namespace_ *)(uVar5 & 0xffffffff),(int)uVar4);
    start_key._M_dataplus._M_p = local_250;
    start_key._M_string_length = (size_type)pcStack_248;
    end_key._M_dataplus._M_p = "value for range 2 key";
    end_key._M_string_length = 0x15;
    leveldb::WriteBatch::Put(&batch,(Slice *)&start_key,(Slice *)&end_key);
    std::__cxx11::string::~string((string *)&local_250);
    uVar4 = extraout_RDX_02;
  }
  leveldb::test::Tester::Tester
            ((Tester *)&local_250,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/issues/issue178_test.cc"
             ,0x36);
  end_key._M_dataplus._M_p = end_key._M_dataplus._M_p & 0xffffffffffffff00;
  (*db->_vptr_DB[4])(&start_key,db,&end_key,&batch);
  leveldb::test::Tester::IsOk((Tester *)&local_250,(Status *)&start_key);
  leveldb::Status::~Status((Status *)&start_key);
  leveldb::test::Tester::~Tester((Tester *)&local_250);
  leveldb::WriteBatch::Clear(&batch);
  uVar4 = extraout_RDX_03;
  for (uVar5 = 0; uVar5 != 1100000; uVar5 = uVar5 + 1) {
    (anonymous_namespace)::Key2_abi_cxx11_
              ((string *)&local_250,(_anonymous_namespace_ *)(uVar5 & 0xffffffff),(int)uVar4);
    start_key._M_dataplus._M_p = local_250;
    start_key._M_string_length = (size_type)pcStack_248;
    leveldb::WriteBatch::Delete(&batch,(Slice *)&start_key);
    std::__cxx11::string::~string((string *)&local_250);
    uVar4 = extraout_RDX_04;
  }
  leveldb::test::Tester::Tester
            ((Tester *)&local_250,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/issues/issue178_test.cc"
             ,0x3d);
  end_key._M_dataplus._M_p = end_key._M_dataplus._M_p & 0xffffffffffffff00;
  (*db->_vptr_DB[4])(&start_key,db,&end_key,&batch);
  leveldb::test::Tester::IsOk((Tester *)&local_250,(Status *)&start_key);
  leveldb::Status::~Status((Status *)&start_key);
  leveldb::test::Tester::~Tester((Tester *)&local_250);
  (anonymous_namespace)::Key1_abi_cxx11_(&start_key,(_anonymous_namespace_ *)0x0,i_00);
  (anonymous_namespace)::Key1_abi_cxx11_(&end_key,(_anonymous_namespace_ *)0x10c8df,i_01);
  greatest.data_._0_4_ = end_key._M_dataplus._M_p._0_4_;
  greatest.data_._4_4_ = end_key._M_dataplus._M_p._4_4_;
  greatest.size_._0_4_ = (undefined4)end_key._M_string_length;
  greatest.size_._4_4_ = end_key._M_string_length._4_4_;
  (*db->_vptr_DB[0xb])();
  local_250 = (pointer)0x100;
  pcStack_248 = (char *)0x0;
  iVar2 = (*db->_vptr_DB[6])();
  plVar3 = (long *)CONCAT44(extraout_var,iVar2);
  num_keys = 0;
  (**(code **)(*plVar3 + 0x18))(plVar3);
  sVar6 = 1;
  while( true ) {
    cVar1 = (**(code **)(*plVar3 + 0x10))(plVar3);
    if (cVar1 == '\0') break;
    num_keys = sVar6;
    (**(code **)(*plVar3 + 0x30))(plVar3);
    sVar6 = sVar6 + 1;
  }
  (**(code **)(*plVar3 + 8))(plVar3);
  leveldb::test::Tester::Tester
            ((Tester *)&local_250,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/issues/issue178_test.cc"
             ,0x4f);
  this = leveldb::test::Tester::IsEq<int,unsigned_long>
                   ((Tester *)&local_250,&(anonymous_namespace)::kNumKeys,&num_keys);
  leveldb::test::Tester::operator<<(this,(char (*) [19])"Bad number of keys");
  leveldb::test::Tester::~Tester((Tester *)&local_250);
  if (db != (DB *)0x0) {
    (*db->_vptr_DB[1])();
  }
  leveldb::Options::Options((Options *)&local_250);
  leveldb::DestroyDB((leveldb *)&local_280,&dbpath,(Options *)&local_250);
  leveldb::Status::~Status(&local_280);
  std::__cxx11::string::~string((string *)&end_key);
  std::__cxx11::string::~string((string *)&start_key);
  leveldb::WriteBatch::~WriteBatch(&batch);
  std::__cxx11::string::~string((string *)&dbpath);
  return;
}

Assistant:

TEST(Issue178, Test) {
  // Get rid of any state from an old run.
  std::string dbpath = leveldb::test::TmpDir() + "/leveldb_cbug_test";
  DestroyDB(dbpath, leveldb::Options());

  // Open database.  Disable compression since it affects the creation
  // of layers and the code below is trying to test against a very
  // specific scenario.
  leveldb::DB* db;
  leveldb::Options db_options;
  db_options.create_if_missing = true;
  db_options.compression = leveldb::kNoCompression;
  ASSERT_OK(leveldb::DB::Open(db_options, dbpath, &db));

  // create first key range
  leveldb::WriteBatch batch;
  for (size_t i = 0; i < kNumKeys; i++) {
    batch.Put(Key1(i), "value for range 1 key");
  }
  ASSERT_OK(db->Write(leveldb::WriteOptions(), &batch));

  // create second key range
  batch.Clear();
  for (size_t i = 0; i < kNumKeys; i++) {
    batch.Put(Key2(i), "value for range 2 key");
  }
  ASSERT_OK(db->Write(leveldb::WriteOptions(), &batch));

  // delete second key range
  batch.Clear();
  for (size_t i = 0; i < kNumKeys; i++) {
    batch.Delete(Key2(i));
  }
  ASSERT_OK(db->Write(leveldb::WriteOptions(), &batch));

  // compact database
  std::string start_key = Key1(0);
  std::string end_key = Key1(kNumKeys - 1);
  leveldb::Slice least(start_key.data(), start_key.size());
  leveldb::Slice greatest(end_key.data(), end_key.size());

  // commenting out the line below causes the example to work correctly
  db->CompactRange(&least, &greatest);

  // count the keys
  leveldb::Iterator* iter = db->NewIterator(leveldb::ReadOptions());
  size_t num_keys = 0;
  for (iter->SeekToFirst(); iter->Valid(); iter->Next()) {
    num_keys++;
  }
  delete iter;
  ASSERT_EQ(kNumKeys, num_keys) << "Bad number of keys";

  // close database
  delete db;
  DestroyDB(dbpath, leveldb::Options());
}